

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O2

float Abc_SclComputeDelayClassPin(SC_Lib *p,SC_Cell *pRepr,int iPin,float Slew,float Gain)

{
  int iVar1;
  int iVar2;
  SC_Cell *pCell;
  bool bVar3;
  float fVar4;
  float fVar5;
  
  fVar5 = 0.0;
  iVar2 = 0;
  iVar1 = 0;
  for (pCell = pRepr; bVar3 = iVar2 == 0, iVar2 = iVar2 + -1, pCell != pRepr || bVar3;
      pCell = pCell->pNext) {
    if (pCell->fSkip == 0) {
      fVar4 = Abc_SclComputeDelayCellPin(p,pCell,iPin,Slew,Gain);
      fVar5 = fVar5 + fVar4;
      iVar1 = iVar1 + 1;
    }
  }
  iVar2 = 1;
  if (1 < iVar1) {
    iVar2 = iVar1;
  }
  return fVar5 / (float)iVar2;
}

Assistant:

float Abc_SclComputeDelayClassPin( SC_Lib * p, SC_Cell * pRepr, int iPin, float Slew, float Gain )
{
    SC_Cell * pCell;
    float Delay = 0;
    int i, Count = 0;
    SC_RingForEachCell( pRepr, pCell, i )
    {
        if ( pCell->fSkip ) 
            continue;
//        if ( pRepr == pCell ) // skip the first gate
//            continue;
        Delay += Abc_SclComputeDelayCellPin( p, pCell, iPin, Slew, Gain );
        Count++;
    }
    return Delay / Abc_MaxInt(1, Count);
}